

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSModel.cpp
# Opt level: O1

XSElementDeclaration * __thiscall
xercesc_4_0::XSModel::getElementDeclaration(XSModel *this,XMLCh *name,XMLCh *compNamespace)

{
  XSNamespaceItem *this_00;
  XSElementDeclaration *pXVar1;
  
  if (compNamespace == (XMLCh *)0x0) {
    compNamespace = L"";
  }
  this_00 = getNamespaceItem(this,compNamespace);
  if (this_00 != (XSNamespaceItem *)0x0) {
    pXVar1 = XSNamespaceItem::getElementDeclaration(this_00,name);
    return pXVar1;
  }
  return (XSElementDeclaration *)0x0;
}

Assistant:

XSElementDeclaration *XSModel::getElementDeclaration(const XMLCh *name
            , const XMLCh *compNamespace)
{
    XSNamespaceItem* namespaceItem;
    if (compNamespace)
        namespaceItem = getNamespaceItem(compNamespace);
    else
        namespaceItem = getNamespaceItem(XMLUni::fgZeroLenString);

    if (namespaceItem)
        return namespaceItem->getElementDeclaration(name);

    return 0;
}